

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

char * cmSourceFileGetProperty(void *arg,char *prop)

{
  cmSourceFile *this;
  int iVar1;
  cmValue cVar2;
  pointer pcVar3;
  allocator<char> local_39;
  string local_38;
  
  this = *arg;
  if (this == (cmSourceFile *)0x0) {
    iVar1 = strcmp(prop,"LOCATION");
    if (iVar1 == 0) {
      return *(char **)((long)arg + 0x48);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,prop,&local_39);
    cVar2 = cmPropertyMap::GetPropertyValue((cmPropertyMap *)((long)arg + 0x80),&local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,prop,&local_39);
    cVar2 = cmSourceFile::GetProperty(this,&local_38);
  }
  if (cVar2.Value == (string *)0x0) {
    pcVar3 = (pointer)0x0;
  }
  else {
    pcVar3 = ((cVar2.Value)->_M_dataplus)._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pcVar3;
}

Assistant:

static const char* CCONV cmSourceFileGetProperty(void* arg, const char* prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    return rsf->GetProperty(prop).GetCStr();
  }
  if (!strcmp(prop, "LOCATION")) {
    return sf->FullPath.c_str();
  }
  return sf->Properties.GetPropertyValue(prop).GetCStr();
}